

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

Option * __thiscall
kj::MainBuilder::Impl::addOption
          (Impl *this,initializer_list<kj::MainBuilder::OptionName> names,bool hasArg,
          StringPtr helpText)

{
  OptionName *pOVar1;
  OptionName *pOVar2;
  char *__s;
  anon_union_8_2_b8f7b3a3_for_OptionName_1 aVar3;
  undefined7 uVar4;
  Option *pOVar5;
  size_t size;
  anon_union_8_2_b8f7b3a3_for_OptionName_1 *params_2;
  long lVar6;
  ulong uVar7;
  ArrayPtr<kj::MainBuilder::OptionName> AVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>,_bool>
  pVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>,_bool> pVar10
  ;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  
  size = names._M_len;
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = size != 0;
  _kjCondition.left = size;
  if (size == 0) {
    _::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
               ,0x118,FAILED,"names.size() > 0",
               "_kjCondition,\"option must have at least one name\"",&_kjCondition,
               (char (*) [35])"option must have at least one name");
    _::Debug::Fault::fatal(&f);
  }
  pOVar5 = Arena::allocate<kj::MainBuilder::Impl::Option>(&this->arena);
  AVar8 = Arena::allocateArray<kj::MainBuilder::OptionName>(&this->arena,size);
  pOVar5->names = AVar8;
  params_2 = &(names._M_array)->field_1;
  lVar6 = size << 4;
  uVar7 = 0;
  do {
    if (lVar6 == 0) {
      pOVar5->hasArg = hasArg;
      (pOVar5->helpText).content.ptr = helpText.content.ptr;
      (pOVar5->helpText).content.size_ = helpText.content.size_;
      return pOVar5;
    }
    pOVar1 = (OptionName *)(params_2 + -1);
    uVar4 = *(undefined7 *)&pOVar1->field_0x1;
    aVar3.longName = *(char **)params_2;
    pOVar2 = (pOVar5->names).ptr + uVar7;
    pOVar2->isLong = pOVar1->isLong;
    *(undefined7 *)&pOVar2->field_0x1 = uVar4;
    (pOVar2->field_1).longName = (char *)aVar3;
    if (pOVar1->isLong == true) {
      __s = params_2->longName;
      _kjCondition._8_8_ = strlen(__s);
      _kjCondition.left = (unsigned_long)__s;
      _kjCondition.op.content.ptr = (char *)pOVar5;
      pVar9 = std::
              _Rb_tree<kj::ArrayPtr<char_const>,std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>,std::_Select1st<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>,std::less<kj::ArrayPtr<char_const>>,std::allocator<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>>
              ::
              _M_emplace_unique<std::pair<kj::ArrayPtr<char_const>,kj::MainBuilder::Impl::Option*>>
                        ((_Rb_tree<kj::ArrayPtr<char_const>,std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>,std::_Select1st<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>,std::less<kj::ArrayPtr<char_const>>,std::allocator<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>>
                          *)&this->longOptions,
                         (pair<kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*> *)
                         &_kjCondition);
      f.exception._0_1_ = pVar9.second;
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        _::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[17],char_const*const&>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
                   ,0x122,FAILED,
                   "longOptions.insert(std::make_pair(StringPtr(name.longName).asArray(), &option)).second"
                   ,"_kjCondition,\"duplicate option\", name.longName",(DebugExpression<bool> *)&f,
                   (char (*) [17])"duplicate option",&params_2->longName);
        _::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
    }
    else {
      _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,params_2->shortName);
      _kjCondition._8_8_ = pOVar5;
      pVar10 = std::
               _Rb_tree<char,std::pair<char_const,kj::MainBuilder::Impl::Option*>,std::_Select1st<std::pair<char_const,kj::MainBuilder::Impl::Option*>>,std::less<char>,std::allocator<std::pair<char_const,kj::MainBuilder::Impl::Option*>>>
               ::_M_emplace_unique<std::pair<char,kj::MainBuilder::Impl::Option*>>
                         ((_Rb_tree<char,std::pair<char_const,kj::MainBuilder::Impl::Option*>,std::_Select1st<std::pair<char_const,kj::MainBuilder::Impl::Option*>>,std::less<char>,std::allocator<std::pair<char_const,kj::MainBuilder::Impl::Option*>>>
                           *)&this->shortOptions,
                          (pair<char,_kj::MainBuilder::Impl::Option_*> *)&_kjCondition);
      f.exception._0_1_ = pVar10.second;
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        _::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[17],char_const&>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
                   ,0x126,FAILED,
                   "shortOptions.insert(std::make_pair(name.shortName, &option)).second",
                   "_kjCondition,\"duplicate option\", name.shortName",(DebugExpression<bool> *)&f,
                   (char (*) [17])"duplicate option",&params_2->shortName);
        _::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
    }
    params_2 = params_2 + 2;
    lVar6 = lVar6 + -0x10;
    uVar7 = (ulong)((int)uVar7 + 1);
  } while( true );
}

Assistant:

Option& addOption(std::initializer_list<OptionName> names, bool hasArg, StringPtr helpText) {
    KJ_REQUIRE(names.size() > 0, "option must have at least one name");

    Option& option = arena.allocate<Option>();
    option.names = arena.allocateArray<OptionName>(names.size());
    uint i = 0;
    for (auto& name: names) {
      option.names[i++] = name;
      if (name.isLong) {
        KJ_REQUIRE(
            longOptions.insert(std::make_pair(StringPtr(name.longName).asArray(), &option)).second,
            "duplicate option", name.longName);
      } else {
        KJ_REQUIRE(
            shortOptions.insert(std::make_pair(name.shortName, &option)).second,
            "duplicate option", name.shortName);
      }
    }
    option.hasArg = hasArg;
    option.helpText = helpText;
    return option;
  }